

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleSerialAnalyzer::WorkerThread(SimpleSerialAnalyzer *this)

{
  U32 UVar1;
  int iVar2;
  MarkerType MVar3;
  AnalyzerChannelData *pAVar4;
  undefined8 uVar5;
  pointer pSVar6;
  undefined8 local_58;
  Frame frame;
  uint local_2c;
  U32 i;
  U64 starting_sample;
  U8 mask;
  U8 data;
  U32 samples_to_first_center_of_first_data_bit;
  U32 samples_per_bit;
  SimpleSerialAnalyzer *this_local;
  
  UVar1 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar1;
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar4;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar5 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::Advance((uint)this->mSerial);
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      pSVar6 = std::
               unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
               ::operator->(&this->mResults);
      MVar3 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pSVar6,MVar3,(Channel *)0x0);
      AnalyzerChannelData::GetBitState();
      AnalyzerChannelData::Advance((uint)this->mSerial);
    }
    Frame::Frame((Frame *)&local_58);
    local_58 = uVar5;
    _frame = AnalyzerChannelData::GetSampleNumber();
    pSVar6 = std::
             unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
             ::operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)pSVar6);
    std::unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
    ::operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame((Frame *)&local_58);
  } while( true );
}

Assistant:

void SimpleSerialAnalyzer::WorkerThread()
{
	mSampleRateHz = GetSampleRate();

	mSerial = GetAnalyzerChannelData( mSettings.mInputChannel );

	if( mSerial->GetBitState() == BIT_LOW )
		mSerial->AdvanceToNextEdge();

	U32 samples_per_bit = mSampleRateHz / mSettings.mBitRate;
	U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings.mBitRate ) );

	for( ; ; )
	{
		U8 data = 0;
		U8 mask = 1 << 7;
		
		mSerial->AdvanceToNextEdge(); //falling edge -- beginning of the start bit

		U64 starting_sample = mSerial->GetSampleNumber();

		mSerial->Advance( samples_to_first_center_of_first_data_bit );

		for( U32 i=0; i<8; i++ )
		{
			//let's put a dot exactly where we sample this bit:
			mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings.mInputChannel );

			if( mSerial->GetBitState() == BIT_HIGH )
				data |= mask;

			mSerial->Advance( samples_per_bit );

			mask = mask >> 1;
		}


		//we have a byte to save. 
		Frame frame;
		frame.mData1 = data;
		frame.mFlags = 0;
		frame.mStartingSampleInclusive = starting_sample;
		frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

		mResults->AddFrame( frame );
		mResults->CommitResults();
		ReportProgress( frame.mEndingSampleInclusive );
	}
}